

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::AVxFirstPassEncoderThreadTest::PreEncodeFrameHook
          (AVxFirstPassEncoderThreadTest *this)

{
  Encoder *in_stack_00000010;
  VideoSource *in_stack_00000018;
  AVxFirstPassEncoderThreadTest *in_stack_00000020;
  
  anon_unknown.dwarf_3e00dc::AVxFirstPassEncoderThreadTest::PreEncodeFrameHook
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource * /*video*/,
                          ::libaom_test::Encoder *encoder) override {
    if (!encoder_initialized_) {
      // Encode in 2-pass mode.
      SetTileSize(encoder);
      encoder->Control(AV1E_SET_ROW_MT, row_mt_);
      encoder->Control(AOME_SET_CPUUSED, set_cpu_used_);
      encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
      encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
      encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 0);

      encoder_initialized_ = true;
    }
  }